

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_Annotation::Internal_GetBBox_InputHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_Annotation *this,ON_Viewport *vp,
          ON_DimStyle *dimstyle,double dimscale,ON_2dPoint *text_point,uint point_count,
          ON_2dPoint *points)

{
  bool bVar1;
  ON_SHA1_Hash *sub_hash;
  double x;
  undefined1 local_100 [8];
  ON_BoundingBox textbbox;
  undefined1 local_b8 [8];
  ON_SHA1 sha1;
  uint point_count_local;
  ON_2dPoint *text_point_local;
  double dimscale_local;
  ON_DimStyle *dimstyle_local;
  ON_Viewport *vp_local;
  ON_Annotation *this_local;
  
  sha1.m_sha1_hash.m_digest._16_4_ = point_count;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_b8);
  if (vp != (ON_Viewport *)0x0) {
    ON_Viewport::ViewProjectionContentHash((ON_SHA1_Hash *)((long)&textbbox.m_max.z + 4),vp);
    ON_SHA1::AccumulateSubHash((ON_SHA1 *)local_b8,(ON_SHA1_Hash *)((long)&textbbox.m_max.z + 4));
  }
  if (dimstyle != (ON_DimStyle *)0x0) {
    sub_hash = ON_DimStyle::ContentHash(dimstyle);
    ON_SHA1::AccumulateSubHash((ON_SHA1 *)local_b8,sub_hash);
  }
  ON_SHA1::AccumulateDouble((ON_SHA1 *)local_b8,dimscale);
  ON_SHA1::Accumulate3dVector((ON_SHA1 *)local_b8,&(this->m_plane).xaxis);
  ON_SHA1::Accumulate3dVector((ON_SHA1 *)local_b8,&(this->m_plane).yaxis);
  ON_SHA1::Accumulate3dVector((ON_SHA1 *)local_b8,&(this->m_plane).zaxis);
  ON_SHA1::AccumulateDoubleArray((ON_SHA1 *)local_b8,4,&(this->m_plane).plane_equation.x);
  if (this->m_text != (ON_TextContent *)0x0) {
    ON_Geometry::BoundingBox((ON_BoundingBox *)local_100,&this->m_text->super_ON_Geometry);
    ON_SHA1::AccumulateBoundingBox((ON_SHA1 *)local_b8,(ON_BoundingBox *)local_100);
    bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_100);
    if ((bVar1) && (bVar1 = DimstyleHasMask(dimstyle), bVar1)) {
      x = ON_DimStyle::MaskBorder(dimstyle);
      ON_SHA1::AccumulateDouble((ON_SHA1 *)local_b8,x);
    }
  }
  ON_SHA1::Accumulate2dPoint((ON_SHA1 *)local_b8,text_point);
  ON_SHA1::AccumulateUnsigned32((ON_SHA1 *)local_b8,sha1.m_sha1_hash.m_digest._16_4_);
  if ((sha1.m_sha1_hash.m_digest._16_4_ != 0) && (points != (ON_2dPoint *)0x0)) {
    ON_SHA1::AccumulateDoubleArray
              ((ON_SHA1 *)local_b8,(ulong)(uint)(sha1.m_sha1_hash.m_digest._16_4_ << 1),&points->x);
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_Annotation::Internal_GetBBox_InputHash(
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  const ON_2dPoint& text_point,
  unsigned int point_count,
  const ON_2dPoint* points
) const
{
  ON_SHA1 sha1;
  if (nullptr != vp)
    sha1.AccumulateSubHash(vp->ViewProjectionContentHash());
  if ( nullptr != dimstyle )
    sha1.AccumulateSubHash(dimstyle->ContentHash());
  sha1.AccumulateDouble(dimscale);
  
  sha1.Accumulate3dVector(m_plane.xaxis);
  sha1.Accumulate3dVector(m_plane.yaxis);
  sha1.Accumulate3dVector(m_plane.zaxis);
  sha1.AccumulateDoubleArray(4,&m_plane.plane_equation.x);

  if (nullptr != m_text)
  {
    // This return ON_TextContent.m_mbox
    // which is a cached value
    const ON_BoundingBox textbbox = m_text->BoundingBox();
    sha1.AccumulateBoundingBox(textbbox);
    if (textbbox.IsNotEmpty() && DimstyleHasMask(dimstyle))
    {
      sha1.AccumulateDouble(dimstyle->MaskBorder());
    }
  }

  sha1.Accumulate2dPoint(text_point);
  sha1.AccumulateUnsigned32(point_count);
  if (point_count > 0 && nullptr != points)
    sha1.AccumulateDoubleArray(2 * point_count, &points[0].x);

  return sha1.Hash();
}